

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O0

void __thiscall
TPZFrontSym<std::complex<double>_>::Compress(TPZFrontSym<std::complex<double>_> *this)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  TPZManVector<long,_10> *pTVar4;
  int64_t iVar5;
  complex<double> *this_00;
  long in_RDI;
  int frontold;
  int64_t j;
  int64_t i;
  int64_t nfound;
  TPZStack<long,_10> from;
  complex<double> *in_stack_fffffffffffffea0;
  complex<double> *in_stack_fffffffffffffea8;
  TPZFrontSym<std::complex<double>_> *in_stack_fffffffffffffeb0;
  int64_t in_stack_fffffffffffffec8;
  TPZManVector<long,_10> *this_01;
  long local_90;
  long local_88;
  TPZVec<long> local_78 [3];
  
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)in_stack_fffffffffffffeb0);
  for (local_88 = 0; local_88 < *(long *)(in_RDI + 0xa0); local_88 = local_88 + 1) {
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_88);
    if (*plVar3 != -1) {
      TPZStack<long,_10>::Push
                ((TPZStack<long,_10> *)in_stack_fffffffffffffeb0,(long)in_stack_fffffffffffffea8);
    }
  }
  pTVar4 = (TPZManVector<long,_10> *)TPZVec<long>::NElements(local_78);
  for (local_88 = 0; local_88 < (long)pTVar4; local_88 = local_88 + 1) {
    plVar3 = TPZVec<long>::operator[](local_78,local_88);
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),*plVar3);
    lVar2 = *plVar3;
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_88);
    *plVar3 = lVar2;
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_88);
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),*plVar3);
    *plVar3 = local_88;
  }
  for (; iVar5 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x10)), local_88 < iVar5;
      local_88 = local_88 + 1) {
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_88);
    *plVar3 = -1;
  }
  this_01 = pTVar4;
  iVar5 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0xb0));
  if ((long)this_01->fExtAlloc + iVar5 + -0x20 != *(long *)(in_RDI + 0xa0)) {
    std::operator<<((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n");
  }
  iVar1 = *(int *)(in_RDI + 0xa0);
  *(TPZManVector<long,_10> **)(in_RDI + 0xa0) = pTVar4;
  TPZManVector<int,_10>::Resize((TPZManVector<int,_10> *)this_01,in_stack_fffffffffffffec8);
  TPZManVector<long,_10>::Resize(this_01,in_stack_fffffffffffffec8);
  iVar5 = TPZVec<std::complex<double>_>::NElements((TPZVec<std::complex<double>_> *)(in_RDI + 0xf8))
  ;
  if (iVar5 != 0) {
    for (local_90 = 0; local_90 < (long)pTVar4; local_90 = local_90 + 1) {
      for (local_88 = 0; local_88 <= local_90; local_88 = local_88 + 1) {
        plVar3 = TPZVec<long>::operator[](local_78,local_88);
        in_stack_fffffffffffffeb0 = (TPZFrontSym<std::complex<double>_> *)*plVar3;
        TPZVec<long>::operator[](local_78,local_90);
        in_stack_fffffffffffffea8 =
             Element(in_stack_fffffffffffffeb0,(int64_t)in_stack_fffffffffffffea8,
                     (int64_t)in_stack_fffffffffffffea0);
        in_stack_fffffffffffffea0 =
             Element(in_stack_fffffffffffffeb0,(int64_t)in_stack_fffffffffffffea8,
                     (int64_t)in_stack_fffffffffffffea0);
        *(undefined8 *)in_stack_fffffffffffffea0->_M_value =
             *(undefined8 *)in_stack_fffffffffffffea8->_M_value;
        *(undefined8 *)(in_stack_fffffffffffffea0->_M_value + 8) =
             *(undefined8 *)(in_stack_fffffffffffffea8->_M_value + 8);
      }
    }
    for (; local_90 < iVar1; local_90 = local_90 + 1) {
      for (local_88 = 0; local_88 <= local_90; local_88 = local_88 + 1) {
        this_00 = Element(in_stack_fffffffffffffeb0,(int64_t)in_stack_fffffffffffffea8,
                          (int64_t)in_stack_fffffffffffffea0);
        std::complex<double>::operator=(this_00,0.0);
      }
    }
  }
  TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1d2e634);
  return;
}

Assistant:

void TPZFrontSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress",output);
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	int frontold = this->fFront;
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i <= j; i++){
			Element(i,j) = Element(from[i], from[j]);
		}
		//		fGlobal[i] = fGlobal[from[i]];
		//		this->fLocal[fGlobal[i]] = i;
	}
	for(;j<frontold;j++) {
		for(i=0;i<= j; i++) Element(i,j) = 0.;
	}
	
	//	Print("After Compress", cout);
	//	PrintGlobal("After Compress",output);
}